

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

void swap_endian(void *data,uint elem_size,uint num)

{
  undefined1 uVar1;
  long lVar2;
  undefined1 *puVar3;
  bool bVar4;
  
  while (bVar4 = num != 0, num = num - 1, bVar4) {
    puVar3 = (undefined1 *)data;
    for (lVar2 = 0; -(elem_size >> 1) != (int)lVar2; lVar2 = lVar2 + -1) {
      uVar1 = *puVar3;
      *puVar3 = *(undefined1 *)((long)data + lVar2 + (ulong)(elem_size - 1));
      *(undefined1 *)((long)data + lVar2 + (ulong)(elem_size - 1)) = uVar1;
      puVar3 = puVar3 + 1;
    }
    data = (void *)((long)data + ((ulong)(elem_size >> 1) - lVar2));
  }
  return;
}

Assistant:

void swap_endian(void *data, unsigned elem_size, unsigned num)
{
	char *src = (char*) data;
	char *dst = src + (elem_size - 1);

	while(num)
	{
		unsigned n = elem_size>>1;
		char tmp;
		while(n)
		{
			tmp = *src;
			*src = *dst;
			*dst = tmp;

			src++;
			dst--;
			n--;
		}

		src = src + (elem_size>>1);
		dst = src + (elem_size - 1);
		num--;
	}
}